

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O2

int CBB_flush(CBB *cbb)

{
  byte bVar1;
  CBB *cbb_00;
  uint8_t *puVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  ulong __n;
  ulong uVar6;
  cbb_buffer_st *base;
  size_t sStack_50;
  uint8_t local_39;
  
  base = (cbb_buffer_st *)&cbb->u;
  if ((cbb->is_child != '\0') && (base = ((cbb_child_st *)base)->base, base == (cbb_buffer_st *)0x0)
     ) {
    return 0;
  }
  if ((base->field_0x18 & 2) != 0) {
    return 0;
  }
  cbb_00 = cbb->child;
  if (cbb_00 == (CBB *)0x0) {
    return 1;
  }
  if (cbb_00->is_child == '\0') {
    __assert_fail("cbb->child->is_child",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbb.cc"
                  ,0xc5,"int CBB_flush(CBB *)");
  }
  if ((cbb_buffer_st *)(cbb_00->u).base.buf != base) {
    __assert_fail("child->base == base",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbb.cc"
                  ,199,"int CBB_flush(CBB *)");
  }
  uVar5 = (ulong)(cbb_00->u).child.pending_len_len + (cbb_00->u).base.len;
  iVar3 = CBB_flush(cbb_00);
  if (((iVar3 == 0) || (sVar4 = (cbb_00->u).base.len, uVar5 < sVar4)) ||
     (__n = base->len - uVar5, base->len < uVar5)) goto LAB_001a6145;
  bVar1 = (cbb_00->u).child.pending_len_len;
  sStack_50 = (size_t)bVar1;
  uVar6 = sStack_50;
  if ((*(byte *)((long)&cbb_00->u + 0x11) & 1) == 0) {
LAB_001a6105:
    while (sStack_50 = sStack_50 - 1, sStack_50 < uVar6) {
      base->buf[sStack_50 + (cbb_00->u).base.len] = (uint8_t)__n;
      __n = __n >> 8;
      uVar6 = (ulong)(cbb_00->u).child.pending_len_len;
    }
    iVar3 = 0x103;
    if (__n == 0) {
      (cbb_00->u).base.buf = (uint8_t *)0x0;
      cbb->child = (CBB *)0x0;
      return 1;
    }
  }
  else {
    if (bVar1 != 1) {
      __assert_fail("child->pending_len_len == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbb.cc"
                    ,0xd9,"int CBB_flush(CBB *)");
    }
    iVar3 = 0xdc;
    if (__n < 0xffffffff) {
      if (__n < 0x1000000) {
        if (0xffff < __n) {
          local_39 = 0x83;
          sStack_50 = 3;
          goto LAB_001a60bc;
        }
        if (0xff < __n) {
          local_39 = 0x82;
          sStack_50 = 2;
          goto LAB_001a60bc;
        }
        if (0x7f < __n) {
          local_39 = 0x81;
          sStack_50 = 1;
          goto LAB_001a60bc;
        }
        sStack_50 = 0;
        local_39 = (uint8_t)__n;
        __n = 0;
      }
      else {
        local_39 = 0x84;
        sStack_50 = 4;
LAB_001a60bc:
        iVar3 = cbb_buffer_add(base,(uint8_t **)0x0,sStack_50);
        if (iVar3 == 0) goto LAB_001a6145;
        memmove(base->buf + uVar5 + sStack_50,base->buf + uVar5,__n);
        sVar4 = (cbb_00->u).base.len;
      }
      puVar2 = base->buf;
      (cbb_00->u).base.len = sVar4 + 1;
      puVar2[sVar4] = local_39;
      (cbb_00->u).child.pending_len_len = (uint8_t)sStack_50;
      uVar6 = sStack_50;
      goto LAB_001a6105;
    }
  }
  ERR_put_error(0xe,0,0x45,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbb.cc"
                ,iVar3);
LAB_001a6145:
  cbb_on_error(cbb);
  return 0;
}

Assistant:

int CBB_flush(CBB *cbb) {
  // If |base| has hit an error, the buffer is in an undefined state, so
  // fail all following calls. In particular, |cbb->child| may point to invalid
  // memory.
  struct cbb_buffer_st *base = cbb_get_base(cbb);
  if (base == NULL || base->error) {
    return 0;
  }

  if (cbb->child == NULL) {
    // Nothing to flush.
    return 1;
  }

  assert(cbb->child->is_child);
  struct cbb_child_st *child = &cbb->child->u.child;
  assert(child->base == base);
  size_t child_start = child->offset + child->pending_len_len;

  size_t len;
  if (!CBB_flush(cbb->child) || child_start < child->offset ||
      base->len < child_start) {
    goto err;
  }

  len = base->len - child_start;

  if (child->pending_is_asn1) {
    // For ASN.1 we assume that we'll only need a single byte for the length.
    // If that turned out to be incorrect, we have to move the contents along
    // in order to make space.
    uint8_t len_len;
    uint8_t initial_length_byte;

    assert(child->pending_len_len == 1);

    if (len > 0xfffffffe) {
      OPENSSL_PUT_ERROR(CRYPTO, ERR_R_OVERFLOW);
      // Too large.
      goto err;
    } else if (len > 0xffffff) {
      len_len = 5;
      initial_length_byte = 0x80 | 4;
    } else if (len > 0xffff) {
      len_len = 4;
      initial_length_byte = 0x80 | 3;
    } else if (len > 0xff) {
      len_len = 3;
      initial_length_byte = 0x80 | 2;
    } else if (len > 0x7f) {
      len_len = 2;
      initial_length_byte = 0x80 | 1;
    } else {
      len_len = 1;
      initial_length_byte = (uint8_t)len;
      len = 0;
    }

    if (len_len != 1) {
      // We need to move the contents along in order to make space.
      size_t extra_bytes = len_len - 1;
      if (!cbb_buffer_add(base, NULL, extra_bytes)) {
        goto err;
      }
      OPENSSL_memmove(base->buf + child_start + extra_bytes,
                      base->buf + child_start, len);
    }
    base->buf[child->offset++] = initial_length_byte;
    child->pending_len_len = len_len - 1;
  }

  for (size_t i = child->pending_len_len - 1; i < child->pending_len_len; i--) {
    base->buf[child->offset + i] = (uint8_t)len;
    len >>= 8;
  }
  if (len != 0) {
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_OVERFLOW);
    goto err;
  }

  child->base = NULL;
  cbb->child = NULL;

  return 1;

err:
  cbb_on_error(cbb);
  return 0;
}